

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteGroup
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  
  uVar7 = field_number << 3;
  pbVar8 = output->cur_;
  if ((output->impl_).end_ <= pbVar8) {
    pbVar8 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar8);
  }
  bVar2 = (byte)uVar7;
  if (uVar7 < 0x80) {
    *pbVar8 = bVar2 | 3;
    pbVar8 = pbVar8 + 1;
  }
  else {
    *pbVar8 = bVar2 | 0x83;
    if (uVar7 < 0x4000) {
      pbVar8[1] = (byte)(uVar7 >> 7);
      pbVar8 = pbVar8 + 2;
    }
    else {
      pbVar8 = pbVar8 + 2;
      uVar6 = uVar7 >> 7;
      do {
        pbVar5 = pbVar8;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar3 = uVar6 >> 7;
        pbVar8 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar3;
      } while (bVar1);
      *pbVar5 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar8;
  iVar4 = (*value->_vptr_MessageLite[0xe])(value,pbVar8,output);
  pbVar8 = (byte *)CONCAT44(extraout_var,iVar4);
  output->cur_ = pbVar8;
  if ((output->impl_).end_ <= pbVar8) {
    pbVar8 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar8);
  }
  if (uVar7 < 0x80) {
    *pbVar8 = bVar2 | 4;
    pbVar8 = pbVar8 + 1;
  }
  else {
    *pbVar8 = bVar2 | 0x84;
    if (uVar7 < 0x4000) {
      pbVar8[1] = (byte)(uVar7 >> 7);
      pbVar8 = pbVar8 + 2;
    }
    else {
      pbVar8 = pbVar8 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar5 = pbVar8;
        pbVar5[-1] = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar8 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar1);
      *pbVar5 = (byte)uVar6;
    }
  }
  output->cur_ = pbVar8;
  return;
}

Assistant:

void WireFormatLite::WriteGroup(int field_number, const MessageLite& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  value.SerializeWithCachedSizes(output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}